

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

CURLcode Curl_cf_create(Curl_cfilter **pcf,Curl_cftype *cft,void *ctx)

{
  Curl_cfilter *pCVar1;
  CURLcode CVar2;
  
  pCVar1 = (Curl_cfilter *)(*Curl_ccalloc)(1,0x28);
  if (pCVar1 == (Curl_cfilter *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pCVar1->cft = cft;
    pCVar1->ctx = ctx;
    CVar2 = CURLE_OK;
  }
  *pcf = pCVar1;
  return CVar2;
}

Assistant:

CURLcode Curl_cf_create(struct Curl_cfilter **pcf,
                        const struct Curl_cftype *cft,
                        void *ctx)
{
  struct Curl_cfilter *cf;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  DEBUGASSERT(cft);
  cf = calloc(1, sizeof(*cf));
  if(!cf)
    goto out;

  cf->cft = cft;
  cf->ctx = ctx;
  result = CURLE_OK;
out:
  *pcf = cf;
  return result;
}